

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Singleton.cpp
# Opt level: O3

Singleton * Singleton::Lookup(char *name)

{
  List<NameSingletonPair> *pLVar1;
  char cVar2;
  long *plVar3;
  char *pcVar4;
  Singleton *pSVar5;
  NameSingletonPair NVar6;
  NameSingletonPair pair;
  NameSingletonPair local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Singleton::Lookup(const char*)",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  pLVar1 = _registry;
  plVar3 = (long *)operator_new(0x18);
  *plVar3 = (long)&PTR_First_00103d60;
  plVar3[1] = (long)pLVar1;
  plVar3[2] = 0;
  if (0 < *(long *)(pLVar1 + 0x10)) {
    do {
      NVar6 = (NameSingletonPair)(**(code **)(*plVar3 + 0x18))(plVar3);
      local_30 = NVar6;
      pcVar4 = NameSingletonPair::GetName(&local_30);
      if (pcVar4 == name) {
        pSVar5 = NameSingletonPair::GetSingleton(&local_30);
        return pSVar5;
      }
      (**(code **)(*plVar3 + 8))(plVar3);
      cVar2 = (**(code **)(*plVar3 + 0x10))(plVar3);
    } while (cVar2 == '\0');
  }
  return (Singleton *)0x0;
}

Assistant:

Singleton* Singleton::Lookup(const char* name)
{

    std::cout << "Singleton::Lookup(const char*)" << std::endl;

    Iterator<NameSingletonPair>* i = _registry->CreateIterator();
    for (i->First(); !i->IsDone(); i->Next()) {
        NameSingletonPair pair = i->CurrentItem();
        if (pair.GetName() == name) {
            return pair.GetSingleton();
        }
    }
    return 0;
}